

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::TaggedUnionExpression::evalImpl
          (ConstantValue *__return_storage_ptr__,TaggedUnionExpression *this,EvalContext *context)

{
  SymbolKind bits;
  bitwidth_t bVar1;
  Symbol *pSVar2;
  CopyPtr<slang::SVUnion> CVar3;
  Type *pTVar4;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_00;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *value;
  Type *this_01;
  ConstantValue initVal;
  CopyPtr<slang::SVUnion> local_90;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_88;
  char local_68;
  ulong local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  local_58._M_index = '\0';
  if (this->valueExpr == (Expression *)0x0) {
LAB_00431f35:
    pTVar4 = (this->super_Expression).type.ptr;
    pSVar2 = this->member;
    this_01 = pTVar4->canonical;
    if (this_01 == (Type *)0x0) {
      Type::resolveCanonical(pTVar4);
      this_01 = pTVar4->canonical;
    }
    pTVar4 = this_01->canonical;
    if (pTVar4 == (Type *)0x0) {
      Type::resolveCanonical(this_01);
      pTVar4 = this_01->canonical;
    }
    if ((pTVar4->super_Symbol).kind == UnpackedUnionType) {
      local_90.ptr = (SVUnion *)&local_88;
      local_68 = '\0';
      local_60 = (ulong)*(uint *)&pSVar2[5].parentScope | 0x100000000;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
        ::_S_vtable._M_arr[(long)(char)local_58._M_index + 1]._M_data)
                ((anon_class_8_1_8991fb9c_conflict1 *)&local_90,
                 (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  *)&local_58);
      CopyPtr<slang::SVUnion>::CopyPtr<slang::SVUnion>(&local_90,(SVUnion *)&local_88);
      CVar3.ptr = local_90.ptr;
      local_90.ptr = (SVUnion *)0x0;
      *(SVUnion **)
       &(__return_storage_ptr__->value).
        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           = CVar3.ptr;
      (__return_storage_ptr__->value).
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index = '\t';
      CopyPtr<slang::SVUnion>::~CopyPtr(&local_90);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_88);
      goto LAB_0043207c;
    }
    bits = this_01[2].super_Symbol.kind;
    if (bits != Unknown) {
      Type::getDefaultValue(__return_storage_ptr__,(this->super_Expression).type.ptr);
      this_00 = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          (&__return_storage_ptr__->value);
      bVar1 = (this_00->super_SVIntStorage).bitWidth;
      SVInt::SVInt((SVInt *)&local_88,bits,(ulong)*(uint *)&pSVar2[5].parentScope,false);
      SVInt::set(this_00,bVar1 - 1,bVar1 - bits,(SVInt *)&local_88);
      if (((0x40 < (uint)local_88._8_4_) || ((local_88._13_1_ & 1) != 0)) &&
         ((void *)local_88._0_8_ != (void *)0x0)) {
        operator_delete__((void *)local_88._0_8_);
      }
      if (local_58._M_index != '\0') {
        value = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)&local_58);
        SVInt::set(this_00,(value->super_SVIntStorage).bitWidth - 1,0,value);
      }
      goto LAB_0043207c;
    }
  }
  else {
    Expression::eval((ConstantValue *)&local_88,this->valueExpr,context);
    local_90.ptr = (SVUnion *)&local_58;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
      ::_S_vtable._M_arr[(long)local_68 + 1]._M_data)
              ((anon_class_8_1_8991fb9c_conflict1 *)&local_90,
               (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)&local_88);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_88);
    if (local_58._M_index != '\0') goto LAB_00431f35;
  }
  (__return_storage_ptr__->value).
  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ._M_index = '\0';
LAB_0043207c:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue TaggedUnionExpression::evalImpl(EvalContext& context) const {
    ConstantValue initVal;
    if (valueExpr) {
        initVal = valueExpr->eval(context);
        if (!initVal)
            return nullptr;
    }

    auto& field = member.as<FieldSymbol>();

    auto& ct = type->getCanonicalType();
    if (ct.isUnpackedUnion()) {
        SVUnion u;
        u.activeMember = field.fieldIndex;
        u.value = std::move(initVal);
        return u;
    }
    else {
        uint32_t tagBits = ct.as<PackedUnionType>().tagBits;
        if (tagBits == 0)
            return nullptr;

        ConstantValue result = type->getDefaultValue();
        auto& resultInt = result.integer();

        // The tag lives in the upper bits and the value is in the lower bits.
        // Any bits in between are undefined.
        bitwidth_t bits = resultInt.getBitWidth();
        resultInt.set(int32_t(bits - 1), int32_t(bits - tagBits),
                      SVInt(tagBits, field.fieldIndex, false));

        if (initVal) {
            auto& valInt = initVal.integer();
            resultInt.set(int32_t(valInt.getBitWidth() - 1), 0, valInt);
        }

        return result;
    }
}